

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_function_impl.h
# Opt level: O2

void __thiscall
dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::
any_function(any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>
             *this,any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>
                   *item)

{
  _Head_base<0UL,_dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_*,_false>
  _Var1;
  
  (this->data)._M_t.
  super___uniq_ptr_impl<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>,_std::default_delete<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_*,_std::default_delete<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_>_>
  .
  super__Head_base<0UL,_dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_*,_false>
  ._M_head_impl = (Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)> *)0x0;
  _Var1._M_head_impl =
       (item->data)._M_t.
       super___uniq_ptr_impl<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>,_std::default_delete<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_*,_std::default_delete<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_>_>
       .
       super__Head_base<0UL,_dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_*,_false>
       ._M_head_impl;
  if (_Var1._M_head_impl != (Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)> *)0x0
     ) {
    (*(_Var1._M_head_impl)->_vptr_Tbase[3])(_Var1._M_head_impl,this);
  }
  return;
}

Assistant:

any_function (
    const any_function& item
)
{
    if (item.data)
    {
        item.data->copy_to(data);
    }
}